

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitfield.cpp
# Opt level: O1

void __thiscall libtorrent::bitfield::resize(bitfield *this,int bits)

{
  _Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_> _Var1;
  int iVar2;
  _Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_> _Var3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  
  _Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
       (this->m_buf).super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
       super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
       super__Head_base<0UL,_unsigned_int_*,_false>;
  if (_Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl == (uint *)0x0) {
    iVar4 = 0;
  }
  else {
    iVar4 = *(int *)_Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
  }
  if (iVar4 != bits) {
    if (bits != 0) {
      iVar4 = bits + 0x3e;
      if (-1 < bits + 0x1f) {
        iVar4 = bits + 0x1f;
      }
      iVar4 = iVar4 >> 5;
      if (_Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl == (uint *)0x0) {
        iVar6 = 0;
      }
      else {
        iVar2 = *(int *)_Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + 0x1f;
        iVar6 = *(int *)_Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + 0x3e;
        if (-1 < iVar2) {
          iVar6 = iVar2;
        }
        iVar6 = iVar6 >> 5;
      }
      if (iVar4 == iVar6) {
        *(int *)_Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = bits;
      }
      else {
        uVar5 = 0xffffffffffffffff;
        if (-0x5f < bits) {
          uVar5 = (long)iVar4 * 4 + 4;
        }
        _Var3.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
             (_Head_base<0UL,_unsigned_int_*,_false>)operator_new__(uVar5);
        *(int *)_Var3.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = bits;
        if (_Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl != (uint *)0x0) {
          iVar2 = iVar4;
          if (iVar6 < iVar4) {
            iVar2 = iVar6;
          }
          memcpy((int *)((long)_Var3.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + 4),
                 (int *)((long)_Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + 4),
                 (long)(iVar2 << 2));
        }
        if (iVar4 - iVar6 != 0 && iVar6 <= iVar4) {
          memset((int *)((long)_Var3.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl +
                        (long)iVar6 * 4) + 1,0,(long)((iVar4 - iVar6) * 4));
        }
        (this->m_buf).super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
        super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
        super__Head_base<0UL,_unsigned_int_*,_false> =
             _Var3.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
        if (_Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl != (uint *)0x0) {
          operator_delete__((void *)_Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl)
          ;
        }
      }
      clear_trailing_bits(this);
      return;
    }
    (this->m_buf).super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
    super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
    super__Head_base<0UL,_unsigned_int_*,_false> = (_Head_base<0UL,_unsigned_int_*,_false>)0x0;
    if (_Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl != (uint *)0x0) {
      operator_delete__((void *)_Var1.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl);
      return;
    }
  }
  return;
}

Assistant:

void bitfield::resize(int const bits)
	{
		if (bits == size()) return;

		TORRENT_ASSERT(bits >= 0);
		if (bits == 0)
		{
			m_buf.reset();
			return;
		}
		int const new_size_words = (bits + 31) / 32;
		int const cur_size_words = num_words();
		if (cur_size_words != new_size_words)
		{
			aux::unique_ptr<std::uint32_t[]> b(new std::uint32_t[std::size_t(new_size_words + 1)]);
#ifdef BOOST_NO_EXCEPTIONS
			if (b == nullptr) std::terminate();
#endif
			b[0] = aux::numeric_cast<std::uint32_t>(bits);
			if (m_buf) std::memcpy(&b[1], buf()
				, aux::numeric_cast<std::size_t>(std::min(new_size_words, cur_size_words) * 4));
			if (new_size_words > cur_size_words)
			{
				std::memset(&b[1 + cur_size_words], 0
					, aux::numeric_cast<std::size_t>((new_size_words - cur_size_words) * 4));
			}
			m_buf = std::move(b);
		}
		else
		{
			m_buf[0] = aux::numeric_cast<std::uint32_t>(bits);
		}

		clear_trailing_bits();
		TORRENT_ASSERT(size() == bits);
	}